

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

int16_t mipsdsp_sat_add_i16(int16_t a,int16_t b,CPUMIPSState_conflict5 *env)

{
  undefined2 local_1a;
  int16_t tempS;
  CPUMIPSState_conflict5 *env_local;
  int16_t b_local;
  int16_t a_local;
  
  local_1a = a + b;
  if ((((int)(short)(a ^ b) ^ 0xffffffffU) & (int)(short)(a ^ local_1a) & 0x8000) != 0) {
    if (a < 1) {
      local_1a = 0x8000;
    }
    else {
      local_1a = 0x7fff;
    }
    set_DSPControl_overflow_flag(1,0x14,env);
  }
  return local_1a;
}

Assistant:

static inline int16_t mipsdsp_sat_add_i16(int16_t a, int16_t b,
                                          CPUMIPSState *env)
{
    int16_t tempS;

    tempS = a + b;

    if (MIPSDSP_OVERFLOW_ADD(a, b, tempS, 0x8000)) {
        if (a > 0) {
            tempS = 0x7FFF;
        } else {
            tempS = 0x8000;
        }
        set_DSPControl_overflow_flag(1, 20, env);
    }

    return tempS;
}